

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::UninterpretedOption_NamePart::MergePartialFromCodedStream
          (UninterpretedOption_NamePart *this,CodedInputStream *input)

{
  uint8 uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  string *value;
  uint8 *puVar4;
  uint8 *puVar5;
  int iVar6;
  uint32 tag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_001f1a4d:
  do {
    while( true ) {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar5 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar3 = tag & 7;
      if (tag >> 3 != 2) break;
      if (uVar3 != 0) goto LAB_001f1b19;
      puVar4 = input->buffer_;
      puVar5 = input->buffer_end_;
LAB_001f1b3f:
      if ((puVar4 < puVar5) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
        iVar6 = (int)(char)uVar1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&uStack_38 + 4));
        if (!bVar2) {
          return false;
        }
        puVar4 = input->buffer_;
        puVar5 = input->buffer_end_;
        iVar6 = uStack_38._4_4_;
      }
      this->is_extension_ = iVar6 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if ((puVar4 == puVar5) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if ((tag >> 3 == 1) && (uVar3 == 2)) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      value = this->name_part_;
      if (value == (string *)internal::kEmptyString_abi_cxx11_) {
        value = (string *)operator_new(0x20);
        (value->_M_dataplus)._M_p = (pointer)&value->field_2;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        this->name_part_ = value;
      }
      bVar2 = internal::WireFormatLite::ReadString(input,value);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_part_->_M_dataplus)._M_p,(int)this->name_part_->_M_string_length,PARSE)
      ;
      puVar4 = input->buffer_;
      puVar5 = input->buffer_end_;
      if ((puVar4 < puVar5) && (*puVar4 == '\x10')) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
        goto LAB_001f1b3f;
      }
      goto LAB_001f1a4d;
    }
LAB_001f1b19:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption_NamePart::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // required string name_part = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name_part()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name_part().data(), this->name_part().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_is_extension;
        break;
      }

      // required bool is_extension = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_is_extension:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_extension_)));
          set_has_is_extension();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}